

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  char cVar1;
  long lVar2;
  char cVar3;
  uint size;
  uint uVar4;
  uint uVar5;
  type tVar6;
  char *pcVar7;
  buffer_appender<char> bVar8;
  int iVar9;
  char *pcVar10;
  void *pvVar11;
  char *pcVar12;
  ulong count;
  int iVar13;
  ulong uVar14;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  locale_ref in_stack_fffffffffffffd68;
  locale_ref in_stack_fffffffffffffd70;
  anon_class_16_2_3f014a30 local_278;
  char local_268 [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_240;
  
  grouping_impl<char>(in_stack_fffffffffffffd70);
  if (in_stack_fffffffffffffd70.locale_ == (void *)0x0) {
    on_dec(this);
  }
  else {
    cVar3 = thousands_sep_impl<char>(in_stack_fffffffffffffd68);
    if (cVar3 != '\0') {
      size = count_digits(this->abs_value);
      uVar14 = (ulong)size;
      pvVar11 = (void *)0x0;
      uVar4 = size;
      do {
        if (in_stack_fffffffffffffd70.locale_ == pvVar11) {
          iVar13 = (int)(uVar4 - 1) /
                   (int)((char *)((long)in_stack_fffffffffffffd68.locale_ + -1))
                        [(long)in_stack_fffffffffffffd70.locale_] +
                   (int)in_stack_fffffffffffffd70.locale_ + size;
LAB_00117d5e:
          format_decimal<char,unsigned_long>(local_268,this->abs_value,size);
          local_240.super_buffer<char>.ptr_ = local_240.store_;
          local_240.super_buffer<char>.size_ = 0;
          local_240.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0012dca8;
          local_240.super_buffer<char>.capacity_ = 500;
          iVar13 = iVar13 + this->prefix_size;
          tVar6 = to_unsigned<int>(iVar13);
          count = (ulong)tVar6;
          buffer<char>::try_resize(&local_240.super_buffer<char>,count);
          iVar9 = 0;
          pcVar7 = local_240.super_buffer<char>.ptr_ + iVar13;
          pcVar10 = (char *)in_stack_fffffffffffffd68.locale_;
          do {
            pcVar12 = pcVar7 + -1;
            do {
              pcVar7 = pcVar12;
              if ((int)uVar14 < 1) {
                if (this->prefix_size != 0) {
                  *pcVar7 = '-';
                }
                local_278.data = local_240.super_buffer<char>.ptr_;
                local_278.size = iVar13;
                bVar8 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_long>::on_num()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                                  ((buffer_appender<char>)
                                   (this->out).
                                   super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                   container,this->specs,count,count,&local_278);
                (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
                     (buffer<char> *)
                     bVar8.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
                basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                          (&local_240);
                goto LAB_00117e4d;
              }
              lVar2 = uVar14 - 1;
              uVar14 = uVar14 - 1;
              *pcVar7 = local_268[lVar2];
              cVar1 = *pcVar10;
              pcVar12 = pcVar7 + -1;
            } while (cVar1 < '\x01');
            iVar9 = iVar9 + 1;
            if ((cVar1 != '\x7f') && (iVar9 % (int)cVar1 == 0)) {
              if (pcVar10 + 1 !=
                  (char *)((long)in_stack_fffffffffffffd68.locale_ +
                          (long)in_stack_fffffffffffffd70.locale_)) {
                iVar9 = 0;
                pcVar10 = pcVar10 + 1;
              }
              *pcVar12 = cVar3;
              pcVar7 = pcVar12;
            }
          } while( true );
        }
        cVar1 = *(char *)((long)in_stack_fffffffffffffd68.locale_ + (long)pvVar11);
        uVar5 = uVar4 - (int)cVar1;
        if ((uVar5 == 0 || (int)uVar4 < (int)cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) {
          iVar13 = size + (int)pvVar11;
          goto LAB_00117d5e;
        }
        pvVar11 = (void *)((long)pvVar11 + 1);
        uVar4 = uVar5;
      } while( true );
    }
    on_dec(this);
  }
LAB_00117e4d:
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += prefix_size;
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size;
    for (int i = num_digits - 1; i >= 0; --i) {
      *--p = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      p -= s.size();
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
    }
    if (prefix_size != 0) p[-1] = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }